

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlencode.c
# Opt level: O1

STRING_HANDLE URL_Encode(STRING_HANDLE input)

{
  char *text;
  STRING_HANDLE pSVar1;
  LOGGER_LOG p_Var2;
  
  if (input != (STRING_HANDLE)0x0) {
    text = STRING_c_str(input);
    pSVar1 = encode_url_data(text);
    return pSVar1;
  }
  p_Var2 = xlogging_get_log_function();
  if (p_Var2 != (LOGGER_LOG)0x0) {
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/urlencode.c"
              ,"URL_Encode",0x11d,1,"URL_Encode:: NULL input");
  }
  return (STRING_HANDLE)0x0;
}

Assistant:

STRING_HANDLE URL_Encode(STRING_HANDLE input)
{
    STRING_HANDLE result;
    if (input == NULL)
    {
        /*Codes_SRS_URL_ENCODE_06_001: [If input is NULL then URL_Encode will return NULL.]*/
        result = NULL;
        LogError("URL_Encode:: NULL input");
    }
    else
    {
        result = encode_url_data(STRING_c_str(input));
    }
    return result;
}